

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_shift_collapse.cpp
# Opt level: O3

RegisterShiftKind optimization::value_shift_collapse::mir_op_to_arm_shift(Op op)

{
  logic_error *this;
  
  if (op - Shl < 3) {
    return (RegisterShiftKind)(0x201 >> ((char)(op - Shl) * '\b' & 0x1fU));
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Input is not a valid shift!");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

arm::RegisterShiftKind mir_op_to_arm_shift(Op op) {
  switch (op) {
    case Op::Shl:
      return arm::RegisterShiftKind::Lsl;
    case Op::Shr:
      return arm::RegisterShiftKind::Lsr;
    case Op::ShrA:
      return arm::RegisterShiftKind::Asr;
    default:
      throw std::logic_error("Input is not a valid shift!");
  }
}